

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O3

void GlInitExtensions(void)

{
  glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)glXGetProcAddress("glGenFramebuffers");
  glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)glXGetProcAddress("glDeleteFramebuffers");
  glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)glXGetProcAddress("glBindFramebuffer");
  glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)glXGetProcAddress("glBlitFramebuffer");
  glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)glXGetProcAddress("glGenRenderbuffers");
  glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)glXGetProcAddress("glDeleteRenderbuffers");
  glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)glXGetProcAddress("glBindRenderbuffer");
  glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)glXGetProcAddress("glIsRenderbuffer");
  glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)glXGetProcAddress("glRenderbufferStorage");
  glRenderbufferStorageMultisample =
       (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)
       glXGetProcAddress("glRenderbufferStorageMultisample");
  glRenderbufferStorageMultisampleEXT =
       (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEEXTPROC)
       glXGetProcAddress("glRenderbufferStorageMultisampleEXT");
  glFramebufferRenderbuffer =
       (PFNGLFRAMEBUFFERRENDERBUFFERPROC)glXGetProcAddress("glFramebufferRenderbuffer");
  glFramebufferTexture2D =
       (PFNGLFRAMEBUFFERTEXTURE2DPROC)glXGetProcAddress("glFramebufferTexture2D");
  glFramebufferTextureLayer =
       (PFNGLFRAMEBUFFERTEXTURELAYERPROC)glXGetProcAddress("glFramebufferTextureLayer");
  glFramebufferTexture2DMultisampleEXT =
       (PFNGLFRAMEBUFFERTEXTURE2DMULTISAMPLEEXTPROC)
       glXGetProcAddress("glFramebufferTexture2DMultisampleEXT");
  glFramebufferTextureMultiviewOVR =
       (PFNGLFRAMEBUFFERTEXTUREMULTIVIEWOVRPROC)
       glXGetProcAddress("glFramebufferTextureMultiviewOVR");
  glFramebufferTextureMultisampleMultiviewOVR =
       (PFNGLFRAMEBUFFERTEXTUREMULTISAMPLEMULTIVIEWOVRPROC)
       glXGetProcAddress("glFramebufferTextureMultisampleMultiviewOVR");
  glCheckFramebufferStatus =
       (PFNGLCHECKFRAMEBUFFERSTATUSPROC)glXGetProcAddress("glCheckFramebufferStatus");
  glCheckNamedFramebufferStatus =
       (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSPROC)glXGetProcAddress("glCheckNamedFramebufferStatus");
  glGenBuffers = (PFNGLGENBUFFERSPROC)glXGetProcAddress("glGenBuffers");
  glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)glXGetProcAddress("glDeleteBuffers");
  glBindBuffer = (PFNGLBINDBUFFERPROC)glXGetProcAddress("glBindBuffer");
  glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)glXGetProcAddress("glBindBufferBase");
  glBufferData = (PFNGLBUFFERDATAPROC)glXGetProcAddress("glBufferData");
  glBufferSubData = (PFNGLBUFFERSUBDATAPROC)glXGetProcAddress("glBufferSubData");
  glBufferStorage = (PFNGLBUFFERSTORAGEPROC)glXGetProcAddress("glBufferStorage");
  glMapBuffer = (PFNGLMAPBUFFERPROC)glXGetProcAddress("glMapBuffer");
  glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)glXGetProcAddress("glMapBufferRange");
  glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)glXGetProcAddress("glUnmapBuffer");
  glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)glXGetProcAddress("glGenVertexArrays");
  glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)glXGetProcAddress("glDeleteVertexArrays");
  glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)glXGetProcAddress("glBindVertexArray");
  glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)glXGetProcAddress("glVertexAttribPointer");
  glVertexAttribIPointer =
       (PFNGLVERTEXATTRIBIPOINTERPROC)glXGetProcAddress("glVertexAttribIPointer");
  glVertexAttribDivisor = (PFNGLVERTEXATTRIBDIVISORPROC)glXGetProcAddress("glVertexAttribDivisor");
  glDisableVertexAttribArray =
       (PFNGLDISABLEVERTEXATTRIBARRAYPROC)glXGetProcAddress("glDisableVertexAttribArray");
  glEnableVertexAttribArray =
       (PFNGLENABLEVERTEXATTRIBARRAYPROC)glXGetProcAddress("glEnableVertexAttribArray");
  glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)glXGetProcAddress("glTexStorage2D");
  glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)glXGetProcAddress("glTexStorage3D");
  glTexImage2DMultisample =
       (PFNGLTEXIMAGE2DMULTISAMPLEPROC)glXGetProcAddress("glTexImage2DMultisample");
  glTexImage3DMultisample =
       (PFNGLTEXIMAGE3DMULTISAMPLEPROC)glXGetProcAddress("glTexImage3DMultisample");
  glTexStorage2DMultisample =
       (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)glXGetProcAddress("glTexStorage2DMultisample");
  glTexStorage3DMultisample =
       (PFNGLTEXSTORAGE3DMULTISAMPLEPROC)glXGetProcAddress("glTexStorage3DMultisample");
  glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)glXGetProcAddress("glGenerateMipmap");
  glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)glXGetProcAddress("glBindImageTexture");
  glCreateProgram = (PFNGLCREATEPROGRAMPROC)glXGetProcAddress("glCreateProgram");
  glDeleteProgram = (PFNGLDELETEPROGRAMPROC)glXGetProcAddress("glDeleteProgram");
  glCreateShader = (PFNGLCREATESHADERPROC)glXGetProcAddress("glCreateShader");
  glDeleteShader = (PFNGLDELETESHADERPROC)glXGetProcAddress("glDeleteShader");
  glShaderSource = (PFNGLSHADERSOURCEPROC)glXGetProcAddress("glShaderSource");
  glCompileShader = (PFNGLCOMPILESHADERPROC)glXGetProcAddress("glCompileShader");
  glGetShaderiv = (PFNGLGETSHADERIVPROC)glXGetProcAddress("glGetShaderiv");
  glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)glXGetProcAddress("glGetShaderInfoLog");
  glUseProgram = (PFNGLUSEPROGRAMPROC)glXGetProcAddress("glUseProgram");
  glAttachShader = (PFNGLATTACHSHADERPROC)glXGetProcAddress("glAttachShader");
  glLinkProgram = (PFNGLLINKPROGRAMPROC)glXGetProcAddress("glLinkProgram");
  glGetProgramiv = (PFNGLGETPROGRAMIVPROC)glXGetProcAddress("glGetProgramiv");
  glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)glXGetProcAddress("glGetProgramInfoLog");
  glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)glXGetProcAddress("glGetAttribLocation");
  glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)glXGetProcAddress("glBindAttribLocation");
  glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)glXGetProcAddress("glGetUniformLocation");
  glGetUniformBlockIndex =
       (PFNGLGETUNIFORMBLOCKINDEXPROC)glXGetProcAddress("glGetUniformBlockIndex");
  glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)glXGetProcAddress("glProgramUniform1i");
  glUniform1i = (PFNGLUNIFORM1IPROC)glXGetProcAddress("glUniform1i");
  glUniform1iv = (PFNGLUNIFORM1IVPROC)glXGetProcAddress("glUniform1iv");
  glUniform2iv = (PFNGLUNIFORM2IVPROC)glXGetProcAddress("glUniform2iv");
  glUniform3iv = (PFNGLUNIFORM3IVPROC)glXGetProcAddress("glUniform3iv");
  glUniform4iv = (PFNGLUNIFORM4IVPROC)glXGetProcAddress("glUniform4iv");
  glUniform1f = (PFNGLUNIFORM1FPROC)glXGetProcAddress("glUniform1f");
  glUniform1fv = (PFNGLUNIFORM1FVPROC)glXGetProcAddress("glUniform1fv");
  glUniform2fv = (PFNGLUNIFORM2FVPROC)glXGetProcAddress("glUniform2fv");
  glUniform3fv = (PFNGLUNIFORM3FVPROC)glXGetProcAddress("glUniform3fv");
  glUniform4fv = (PFNGLUNIFORM4FVPROC)glXGetProcAddress("glUniform4fv");
  glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)glXGetProcAddress("glUniformMatrix2fv");
  glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)glXGetProcAddress("glUniformMatrix2x3fv");
  glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)glXGetProcAddress("glUniformMatrix2x4fv");
  glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)glXGetProcAddress("glUniformMatrix3x2fv");
  glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)glXGetProcAddress("glUniformMatrix3fv");
  glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)glXGetProcAddress("glUniformMatrix3x4fv");
  glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)glXGetProcAddress("glUniformMatrix4x2fv");
  glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)glXGetProcAddress("glUniformMatrix4x3fv");
  glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)glXGetProcAddress("glUniformMatrix4fv");
  glGetProgramResourceIndex =
       (PFNGLGETPROGRAMRESOURCEINDEXPROC)glXGetProcAddress("glGetProgramResourceIndex");
  glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)glXGetProcAddress("glUniformBlockBinding");
  glShaderStorageBlockBinding =
       (PFNGLSHADERSTORAGEBLOCKBINDINGPROC)glXGetProcAddress("glShaderStorageBlockBinding");
  glDrawElementsInstanced =
       (PFNGLDRAWELEMENTSINSTANCEDPROC)glXGetProcAddress("glDrawElementsInstanced");
  glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)glXGetProcAddress("glDispatchCompute");
  glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)glXGetProcAddress("glMemoryBarrier");
  glGenQueries = (PFNGLGENQUERIESPROC)glXGetProcAddress("glGenQueries");
  glDeleteQueries = (PFNGLDELETEQUERIESPROC)glXGetProcAddress("glDeleteQueries");
  glIsQuery = (PFNGLISQUERYPROC)glXGetProcAddress("glIsQuery");
  glBeginQuery = (PFNGLBEGINQUERYPROC)glXGetProcAddress("glBeginQuery");
  glEndQuery = (PFNGLENDQUERYPROC)glXGetProcAddress("glEndQuery");
  glQueryCounter = (PFNGLQUERYCOUNTERPROC)glXGetProcAddress("glQueryCounter");
  glGetQueryiv = (PFNGLGETQUERYIVPROC)glXGetProcAddress("glGetQueryiv");
  glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)glXGetProcAddress("glGetQueryObjectiv");
  glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)glXGetProcAddress("glGetQueryObjectuiv");
  glGetQueryObjecti64v = (PFNGLGETQUERYOBJECTI64VPROC)glXGetProcAddress("glGetQueryObjecti64v");
  glGetQueryObjectui64v = (PFNGLGETQUERYOBJECTUI64VPROC)glXGetProcAddress("glGetQueryObjectui64v");
  glFenceSync = (PFNGLFENCESYNCPROC)glXGetProcAddress("glFenceSync");
  glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)glXGetProcAddress("glClientWaitSync");
  glDeleteSync = (PFNGLDELETESYNCPROC)glXGetProcAddress("glDeleteSync");
  glIsSync = (PFNGLISSYNCPROC)glXGetProcAddress("glIsSync");
  glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)glXGetProcAddress("glBlendFuncSeparate");
  glBlendEquationSeparate =
       (PFNGLBLENDEQUATIONSEPARATEPROC)glXGetProcAddress("glBlendEquationSeparate");
  glDebugMessageControl = (PFNGLDEBUGMESSAGECONTROLPROC)glXGetProcAddress("glDebugMessageControl");
  glDebugMessageCallback =
       (PFNGLDEBUGMESSAGECALLBACKPROC)glXGetProcAddress("glDebugMessageCallback");
  glBindSampler = (PFNGLBINDSAMPLERPROC)glXGetProcAddress("glBindSampler");
  glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)glXGetProcAddress("glDeleteSamplers");
  glGenSamplers = (PFNGLGENSAMPLERSPROC)glXGetProcAddress("glGenSamplers");
  glGetSamplerParameterIiv =
       (PFNGLGETSAMPLERPARAMETERIIVPROC)glXGetProcAddress("glGetSamplerParameterIiv");
  glGetSamplerParameterIuiv =
       (PFNGLGETSAMPLERPARAMETERIUIVPROC)glXGetProcAddress("glGetSamplerParameterIuiv");
  glGetSamplerParameterfv =
       (PFNGLGETSAMPLERPARAMETERFVPROC)glXGetProcAddress("glGetSamplerParameterfv");
  glGetSamplerParameteriv =
       (PFNGLGETSAMPLERPARAMETERIVPROC)glXGetProcAddress("glGetSamplerParameteriv");
  glIsSampler = (PFNGLISSAMPLERPROC)glXGetProcAddress("glIsSampler");
  glSamplerParameterIiv = (PFNGLSAMPLERPARAMETERIIVPROC)glXGetProcAddress("glSamplerParameterIiv");
  glSamplerParameterIuiv =
       (PFNGLSAMPLERPARAMETERIUIVPROC)glXGetProcAddress("glSamplerParameterIuiv");
  glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)glXGetProcAddress("glSamplerParameterf");
  glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)glXGetProcAddress("glSamplerParameterfv");
  glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)glXGetProcAddress("glSamplerParameteri");
  glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)glXGetProcAddress("glSamplerParameteriv");
  glExtensions.timer_query = GlCheckExtension("GL_EXT_timer_query");
  glExtensions.texture_clamp_to_border = true;
  GlCheckExtension("GL_EXT_buffer_storage");
  glExtensions.buffer_storage = true;
  GlCheckExtension("GL_ARB_texture_storage_multisample");
  glExtensions.multi_sampled_storage = true;
  glExtensions.multi_view = GlCheckExtension("GL_OVR_multiview2");
  glExtensions.multi_sampled_resolve = GlCheckExtension("GL_EXT_multisampled_render_to_texture");
  glExtensions.multi_view_multi_sampled_resolve =
       GlCheckExtension("GL_OVR_multiview_multisampled_render_to_texture");
  glExtensions.texture_clamp_to_border_id = 0x812d;
  return;
}

Assistant:

void GlInitExtensions() {
    glGenFramebuffers = (PFNGLGENFRAMEBUFFERSPROC)GetExtension("glGenFramebuffers");
    glDeleteFramebuffers = (PFNGLDELETEFRAMEBUFFERSPROC)GetExtension("glDeleteFramebuffers");
    glBindFramebuffer = (PFNGLBINDFRAMEBUFFERPROC)GetExtension("glBindFramebuffer");
    glBlitFramebuffer = (PFNGLBLITFRAMEBUFFERPROC)GetExtension("glBlitFramebuffer");
    glGenRenderbuffers = (PFNGLGENRENDERBUFFERSPROC)GetExtension("glGenRenderbuffers");
    glDeleteRenderbuffers = (PFNGLDELETERENDERBUFFERSPROC)GetExtension("glDeleteRenderbuffers");
    glBindRenderbuffer = (PFNGLBINDRENDERBUFFERPROC)GetExtension("glBindRenderbuffer");
    glIsRenderbuffer = (PFNGLISRENDERBUFFERPROC)GetExtension("glIsRenderbuffer");
    glRenderbufferStorage = (PFNGLRENDERBUFFERSTORAGEPROC)GetExtension("glRenderbufferStorage");
    glRenderbufferStorageMultisample = (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEPROC)GetExtension("glRenderbufferStorageMultisample");
    glRenderbufferStorageMultisampleEXT =
        (PFNGLRENDERBUFFERSTORAGEMULTISAMPLEEXTPROC)GetExtension("glRenderbufferStorageMultisampleEXT");
    glFramebufferRenderbuffer = (PFNGLFRAMEBUFFERRENDERBUFFERPROC)GetExtension("glFramebufferRenderbuffer");
    glFramebufferTexture2D = (PFNGLFRAMEBUFFERTEXTURE2DPROC)GetExtension("glFramebufferTexture2D");
    glFramebufferTextureLayer = (PFNGLFRAMEBUFFERTEXTURELAYERPROC)GetExtension("glFramebufferTextureLayer");
    glFramebufferTexture2DMultisampleEXT =
        (PFNGLFRAMEBUFFERTEXTURE2DMULTISAMPLEEXTPROC)GetExtension("glFramebufferTexture2DMultisampleEXT");
    glFramebufferTextureMultiviewOVR = (PFNGLFRAMEBUFFERTEXTUREMULTIVIEWOVRPROC)GetExtension("glFramebufferTextureMultiviewOVR");
    glFramebufferTextureMultisampleMultiviewOVR =
        (PFNGLFRAMEBUFFERTEXTUREMULTISAMPLEMULTIVIEWOVRPROC)GetExtension("glFramebufferTextureMultisampleMultiviewOVR");
    glCheckFramebufferStatus = (PFNGLCHECKFRAMEBUFFERSTATUSPROC)GetExtension("glCheckFramebufferStatus");
    glCheckNamedFramebufferStatus = (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSPROC)GetExtension("glCheckNamedFramebufferStatus");

    glGenBuffers = (PFNGLGENBUFFERSPROC)GetExtension("glGenBuffers");
    glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)GetExtension("glDeleteBuffers");
    glBindBuffer = (PFNGLBINDBUFFERPROC)GetExtension("glBindBuffer");
    glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)GetExtension("glBindBufferBase");
    glBufferData = (PFNGLBUFFERDATAPROC)GetExtension("glBufferData");
    glBufferSubData = (PFNGLBUFFERSUBDATAPROC)GetExtension("glBufferSubData");
    glBufferStorage = (PFNGLBUFFERSTORAGEPROC)GetExtension("glBufferStorage");
    glMapBuffer = (PFNGLMAPBUFFERPROC)GetExtension("glMapBuffer");
    glMapBufferRange = (PFNGLMAPBUFFERRANGEPROC)GetExtension("glMapBufferRange");
    glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)GetExtension("glUnmapBuffer");

    glGenVertexArrays = (PFNGLGENVERTEXARRAYSPROC)GetExtension("glGenVertexArrays");
    glDeleteVertexArrays = (PFNGLDELETEVERTEXARRAYSPROC)GetExtension("glDeleteVertexArrays");
    glBindVertexArray = (PFNGLBINDVERTEXARRAYPROC)GetExtension("glBindVertexArray");
    glVertexAttribPointer = (PFNGLVERTEXATTRIBPOINTERPROC)GetExtension("glVertexAttribPointer");
    glVertexAttribIPointer = (PFNGLVERTEXATTRIBIPOINTERPROC)GetExtension("glVertexAttribIPointer");
    glVertexAttribDivisor = (PFNGLVERTEXATTRIBDIVISORPROC)GetExtension("glVertexAttribDivisor");
    glDisableVertexAttribArray = (PFNGLDISABLEVERTEXATTRIBARRAYPROC)GetExtension("glDisableVertexAttribArray");
    glEnableVertexAttribArray = (PFNGLENABLEVERTEXATTRIBARRAYPROC)GetExtension("glEnableVertexAttribArray");

#if defined(OS_WINDOWS)
    glActiveTexture = (PFNGLACTIVETEXTUREPROC)GetExtension("glActiveTexture");
    glTexImage3D = (PFNGLTEXIMAGE3DPROC)GetExtension("glTexImage3D");
    glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)GetExtension("glCompressedTexImage2D");
    glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)GetExtension("glCompressedTexImage3D");
    glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)GetExtension("glTexSubImage3D");
    glCompressedTexSubImage2D = (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)GetExtension("glCompressedTexSubImage2D");
    glCompressedTexSubImage3D = (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)GetExtension("glCompressedTexSubImage3D");
#endif
    glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)GetExtension("glTexStorage2D");
    glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)GetExtension("glTexStorage3D");
    glTexImage2DMultisample = (PFNGLTEXIMAGE2DMULTISAMPLEPROC)GetExtension("glTexImage2DMultisample");
    glTexImage3DMultisample = (PFNGLTEXIMAGE3DMULTISAMPLEPROC)GetExtension("glTexImage3DMultisample");
    glTexStorage2DMultisample = (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)GetExtension("glTexStorage2DMultisample");
    glTexStorage3DMultisample = (PFNGLTEXSTORAGE3DMULTISAMPLEPROC)GetExtension("glTexStorage3DMultisample");
    glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)GetExtension("glGenerateMipmap");
    glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)GetExtension("glBindImageTexture");

    glCreateProgram = (PFNGLCREATEPROGRAMPROC)GetExtension("glCreateProgram");
    glDeleteProgram = (PFNGLDELETEPROGRAMPROC)GetExtension("glDeleteProgram");
    glCreateShader = (PFNGLCREATESHADERPROC)GetExtension("glCreateShader");
    glDeleteShader = (PFNGLDELETESHADERPROC)GetExtension("glDeleteShader");
    glShaderSource = (PFNGLSHADERSOURCEPROC)GetExtension("glShaderSource");
    glCompileShader = (PFNGLCOMPILESHADERPROC)GetExtension("glCompileShader");
    glGetShaderiv = (PFNGLGETSHADERIVPROC)GetExtension("glGetShaderiv");
    glGetShaderInfoLog = (PFNGLGETSHADERINFOLOGPROC)GetExtension("glGetShaderInfoLog");
    glUseProgram = (PFNGLUSEPROGRAMPROC)GetExtension("glUseProgram");
    glAttachShader = (PFNGLATTACHSHADERPROC)GetExtension("glAttachShader");
    glLinkProgram = (PFNGLLINKPROGRAMPROC)GetExtension("glLinkProgram");
    glGetProgramiv = (PFNGLGETPROGRAMIVPROC)GetExtension("glGetProgramiv");
    glGetProgramInfoLog = (PFNGLGETPROGRAMINFOLOGPROC)GetExtension("glGetProgramInfoLog");
    glGetAttribLocation = (PFNGLGETATTRIBLOCATIONPROC)GetExtension("glGetAttribLocation");
    glBindAttribLocation = (PFNGLBINDATTRIBLOCATIONPROC)GetExtension("glBindAttribLocation");
    glGetUniformLocation = (PFNGLGETUNIFORMLOCATIONPROC)GetExtension("glGetUniformLocation");
    glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC)GetExtension("glGetUniformBlockIndex");
    glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)GetExtension("glProgramUniform1i");
    glUniform1i = (PFNGLUNIFORM1IPROC)GetExtension("glUniform1i");
    glUniform1iv = (PFNGLUNIFORM1IVPROC)GetExtension("glUniform1iv");
    glUniform2iv = (PFNGLUNIFORM2IVPROC)GetExtension("glUniform2iv");
    glUniform3iv = (PFNGLUNIFORM3IVPROC)GetExtension("glUniform3iv");
    glUniform4iv = (PFNGLUNIFORM4IVPROC)GetExtension("glUniform4iv");
    glUniform1f = (PFNGLUNIFORM1FPROC)GetExtension("glUniform1f");
    glUniform1fv = (PFNGLUNIFORM1FVPROC)GetExtension("glUniform1fv");
    glUniform2fv = (PFNGLUNIFORM2FVPROC)GetExtension("glUniform2fv");
    glUniform3fv = (PFNGLUNIFORM3FVPROC)GetExtension("glUniform3fv");
    glUniform4fv = (PFNGLUNIFORM4FVPROC)GetExtension("glUniform4fv");
    glUniformMatrix2fv = (PFNGLUNIFORMMATRIX2FVPROC)GetExtension("glUniformMatrix2fv");
    glUniformMatrix2x3fv = (PFNGLUNIFORMMATRIX2X3FVPROC)GetExtension("glUniformMatrix2x3fv");
    glUniformMatrix2x4fv = (PFNGLUNIFORMMATRIX2X4FVPROC)GetExtension("glUniformMatrix2x4fv");
    glUniformMatrix3x2fv = (PFNGLUNIFORMMATRIX3X2FVPROC)GetExtension("glUniformMatrix3x2fv");
    glUniformMatrix3fv = (PFNGLUNIFORMMATRIX3FVPROC)GetExtension("glUniformMatrix3fv");
    glUniformMatrix3x4fv = (PFNGLUNIFORMMATRIX3X4FVPROC)GetExtension("glUniformMatrix3x4fv");
    glUniformMatrix4x2fv = (PFNGLUNIFORMMATRIX4X2FVPROC)GetExtension("glUniformMatrix4x2fv");
    glUniformMatrix4x3fv = (PFNGLUNIFORMMATRIX4X3FVPROC)GetExtension("glUniformMatrix4x3fv");
    glUniformMatrix4fv = (PFNGLUNIFORMMATRIX4FVPROC)GetExtension("glUniformMatrix4fv");
    glGetProgramResourceIndex = (PFNGLGETPROGRAMRESOURCEINDEXPROC)GetExtension("glGetProgramResourceIndex");
    glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC)GetExtension("glUniformBlockBinding");
    glShaderStorageBlockBinding = (PFNGLSHADERSTORAGEBLOCKBINDINGPROC)GetExtension("glShaderStorageBlockBinding");

    glDrawElementsInstanced = (PFNGLDRAWELEMENTSINSTANCEDPROC)GetExtension("glDrawElementsInstanced");
    glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)GetExtension("glDispatchCompute");
    glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)GetExtension("glMemoryBarrier");

    glGenQueries = (PFNGLGENQUERIESPROC)GetExtension("glGenQueries");
    glDeleteQueries = (PFNGLDELETEQUERIESPROC)GetExtension("glDeleteQueries");
    glIsQuery = (PFNGLISQUERYPROC)GetExtension("glIsQuery");
    glBeginQuery = (PFNGLBEGINQUERYPROC)GetExtension("glBeginQuery");
    glEndQuery = (PFNGLENDQUERYPROC)GetExtension("glEndQuery");
    glQueryCounter = (PFNGLQUERYCOUNTERPROC)GetExtension("glQueryCounter");
    glGetQueryiv = (PFNGLGETQUERYIVPROC)GetExtension("glGetQueryiv");
    glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)GetExtension("glGetQueryObjectiv");
    glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)GetExtension("glGetQueryObjectuiv");
    glGetQueryObjecti64v = (PFNGLGETQUERYOBJECTI64VPROC)GetExtension("glGetQueryObjecti64v");
    glGetQueryObjectui64v = (PFNGLGETQUERYOBJECTUI64VPROC)GetExtension("glGetQueryObjectui64v");

    glFenceSync = (PFNGLFENCESYNCPROC)GetExtension("glFenceSync");
    glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)GetExtension("glClientWaitSync");
    glDeleteSync = (PFNGLDELETESYNCPROC)GetExtension("glDeleteSync");
    glIsSync = (PFNGLISSYNCPROC)GetExtension("glIsSync");

    glBlendFuncSeparate = (PFNGLBLENDFUNCSEPARATEPROC)GetExtension("glBlendFuncSeparate");
    glBlendEquationSeparate = (PFNGLBLENDEQUATIONSEPARATEPROC)GetExtension("glBlendEquationSeparate");

#if defined(OS_WINDOWS)
    glBlendColor = (PFNGLBLENDCOLORPROC)GetExtension("glBlendColor");
#endif

    glDebugMessageControl = (PFNGLDEBUGMESSAGECONTROLPROC)GetExtension("glDebugMessageControl");
    glDebugMessageCallback = (PFNGLDEBUGMESSAGECALLBACKPROC)GetExtension("glDebugMessageCallback");

    glBindSampler = (PFNGLBINDSAMPLERPROC)GetExtension("glBindSampler");
    glDeleteSamplers = (PFNGLDELETESAMPLERSPROC)GetExtension("glDeleteSamplers");
    glGenSamplers = (PFNGLGENSAMPLERSPROC)GetExtension("glGenSamplers");
    glGetSamplerParameterIiv = (PFNGLGETSAMPLERPARAMETERIIVPROC)GetExtension("glGetSamplerParameterIiv");
    glGetSamplerParameterIuiv = (PFNGLGETSAMPLERPARAMETERIUIVPROC)GetExtension("glGetSamplerParameterIuiv");
    glGetSamplerParameterfv = (PFNGLGETSAMPLERPARAMETERFVPROC)GetExtension("glGetSamplerParameterfv");
    glGetSamplerParameteriv = (PFNGLGETSAMPLERPARAMETERIVPROC)GetExtension("glGetSamplerParameteriv");
    glIsSampler = (PFNGLISSAMPLERPROC)GetExtension("glIsSampler");
    glSamplerParameterIiv = (PFNGLSAMPLERPARAMETERIIVPROC)GetExtension("glSamplerParameterIiv");
    glSamplerParameterIuiv = (PFNGLSAMPLERPARAMETERIUIVPROC)GetExtension("glSamplerParameterIuiv");
    glSamplerParameterf = (PFNGLSAMPLERPARAMETERFPROC)GetExtension("glSamplerParameterf");
    glSamplerParameterfv = (PFNGLSAMPLERPARAMETERFVPROC)GetExtension("glSamplerParameterfv");
    glSamplerParameteri = (PFNGLSAMPLERPARAMETERIPROC)GetExtension("glSamplerParameteri");
    glSamplerParameteriv = (PFNGLSAMPLERPARAMETERIVPROC)GetExtension("glSamplerParameteriv");

    glExtensions.timer_query = GlCheckExtension("GL_EXT_timer_query");
    glExtensions.texture_clamp_to_border = true;  // always available
    glExtensions.buffer_storage =
        GlCheckExtension("GL_EXT_buffer_storage") || (OPENGL_VERSION_MAJOR * 10 + OPENGL_VERSION_MINOR >= 44);
    glExtensions.multi_sampled_storage =
        GlCheckExtension("GL_ARB_texture_storage_multisample") || (OPENGL_VERSION_MAJOR * 10 + OPENGL_VERSION_MINOR >= 43);
    glExtensions.multi_view = GlCheckExtension("GL_OVR_multiview2");
    glExtensions.multi_sampled_resolve = GlCheckExtension("GL_EXT_multisampled_render_to_texture");
    glExtensions.multi_view_multi_sampled_resolve = GlCheckExtension("GL_OVR_multiview_multisampled_render_to_texture");

    glExtensions.texture_clamp_to_border_id = GL_CLAMP_TO_BORDER;
}